

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

wstring * __thiscall
phosg::wstring_vprintf_abi_cxx11_
          (wstring *__return_storage_ptr__,phosg *this,wchar_t *fmt,__va_list_tag *va)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  wchar_t *__s;
  va_list tmp_va;
  ssize_t written;
  __va_list_tag *va_local;
  wchar_t *fmt_local;
  wstring *result;
  
  ::std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  sVar3 = wcslen((wchar_t *)this);
  ::std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::resize
            (__return_storage_ptr__,sVar3 * 2);
  tmp_va[0].reg_save_area = (void *)0xffffffffffffffff;
  while( true ) {
    bVar1 = true;
    if (-1 < (long)tmp_va[0].reg_save_area) {
      sVar4 = ::std::__cxx11::
              basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                        (__return_storage_ptr__);
      bVar1 = (long)sVar4 < (long)tmp_va[0].reg_save_area;
    }
    if (!bVar1) break;
    __s = ::std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
          ::data(__return_storage_ptr__);
    sVar4 = ::std::__cxx11::
            basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                      (__return_storage_ptr__);
    iVar2 = vswprintf(__s,sVar4,(wchar_t *)this,fmt);
    tmp_va[0].reg_save_area = (void *)(long)iVar2;
  }
  ::std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::resize
            (__return_storage_ptr__,(size_type)tmp_va[0].reg_save_area);
  return __return_storage_ptr__;
}

Assistant:

wstring wstring_vprintf(const wchar_t* fmt, va_list va) {
  // TODO: use open_wmemstream when it's available on mac os
  wstring result;
  result.resize(wcslen(fmt) * 2); // silly guess

  ssize_t written = -1;
  while ((written < 0) || (written > static_cast<ssize_t>(result.size()))) {
    va_list tmp_va;
    va_copy(tmp_va, va);
    written = vswprintf(result.data(), result.size(), fmt, va);
    va_end(tmp_va);
  }
  result.resize(written);
  return result;
}